

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  undefined1 local_f0 [8];
  SHA256_CTX shactx_1;
  SHA256_CTX shactx;
  AppCtx *ctx_local;
  
  os_mkdir("perfprof-dump",true);
  os_mkdir("perfprof-dump/cache",true);
  sha256_init((SHA256_CTX *)(shactx_1.state + 6));
  sha256_update((SHA256_CTX *)(shactx_1.state + 6),(BYTE *)"./build/Release/src/cptp",0x18);
  sha256_finalize_to_cstr((SHA256_CTX *)(shactx_1.state + 6),(Hash *)ctx);
  sha256_init((SHA256_CTX *)local_f0);
  sha256_update((SHA256_CTX *)local_f0,(BYTE *)"libRCSP DP pricer",0x11);
  sha256_finalize_to_cstr((SHA256_CTX *)local_f0,(Hash *)(ctx + 0x41));
  return extraout_EAX;
}

Assistant:

static void init(AppCtx *ctx) {
    os_mkdir(PERFPROF_DUMP_ROOTDIR, true);
    os_mkdir(PERFPROF_DUMP_ROOTDIR "/cache", true);

    // Compute the cptp exe hash
    {
        SHA256_CTX shactx;

        sha256_init(&shactx);
        sha256_update(&shactx, (BYTE *)CPTP_EXE, strlen(CPTP_EXE));
        sha256_finalize_to_cstr(&shactx, &ctx->cptp_exe_hash);
    }
    // Compute the BAPCOD exe hash
    {
        SHA256_CTX shactx;

        sha256_init(&shactx);
        sha256_update(&shactx, (BYTE *)BAPCOD_SOLVER_NAME,
                      strlen(BAPCOD_SOLVER_NAME));
        sha256_finalize_to_cstr(&shactx, &ctx->bapcod_virtual_exe_hash);
    }
}